

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeleLM.cpp
# Opt level: O3

void __thiscall
PeleLM::scalar_advection_update(PeleLM *this,Real dt,int first_scalar,int last_scalar)

{
  pointer pSVar1;
  __uniq_ptr_data<amrex::MultiFab,_std::default_delete<amrex::MultiFab>,_true,_true> this_00;
  __uniq_ptr_data<amrex::MultiFab,_std::default_delete<amrex::MultiFab>,_true,_true> this_01;
  int iVar2;
  int iVar3;
  TimeCenter TVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  double *pdVar9;
  double *pdVar10;
  double *pdVar11;
  double *pdVar12;
  double *pdVar13;
  double *pdVar14;
  double *pdVar15;
  long lVar16;
  double *pdVar17;
  bool bVar18;
  Real time;
  MFIter mfi;
  Box local_1ac;
  Array4<const_double> local_190;
  Array4<const_double> local_150;
  Array4<const_double> local_110;
  Array4<double> local_d0;
  MFIter local_90;
  
  pSVar1 = (this->super_NavierStokesBase).super_AmrLevel.state.
           super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
           super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
           super__Vector_impl_data._M_start;
  TVar4 = amrex::StateDescriptor::timeType(pSVar1->desc);
  if (TVar4 == Point) {
    time = (pSVar1->new_time).stop;
  }
  else {
    time = ((pSVar1->new_time).start + (pSVar1->new_time).stop) * 0.5;
  }
  pSVar1 = (this->super_NavierStokesBase).super_AmrLevel.state.
           super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
           super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
           super__Vector_impl_data._M_start;
  this_00.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
  super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
  super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
       (pSVar1->new_data)._M_t.
       super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>;
  this_01.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
  super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
  super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
       (pSVar1->old_data)._M_t.
       super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>;
  amrex::MFIter::MFIter
            (&local_90,
             (FabArrayBase *)
             this_00.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>.
             _M_t.super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
             super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,true);
  if (local_90.currentIndex < local_90.endIndex) {
    lVar6 = (long)first_scalar * 8;
    do {
      amrex::MFIter::tilebox(&local_1ac,&local_90);
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&local_d0,
                 (FabArray<amrex::FArrayBox> *)
                 this_00.
                 super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
                 super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
                 super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,&local_90);
      amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (&local_110,
                 (FabArray<amrex::FArrayBox> *)
                 this_01.
                 super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
                 super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
                 super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,&local_90);
      amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (&local_150,&((this->super_NavierStokesBase).aofs)->super_FabArray<amrex::FArrayBox>
                 ,&local_90);
      amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (&local_190,&(this->external_sources).super_FabArray<amrex::FArrayBox>,&local_90);
      if (local_1ac.smallend.vect[2] <= local_1ac.bigend.vect[2]) {
        lVar7 = (long)local_1ac.smallend.vect[0];
        iVar2 = local_1ac.smallend.vect[2];
        do {
          if (local_1ac.smallend.vect[1] <= local_1ac.bigend.vect[1]) {
            lVar8 = (long)iVar2;
            iVar3 = local_1ac.smallend.vect[1];
            do {
              if (local_1ac.smallend.vect[0] <= local_1ac.bigend.vect[0]) {
                lVar16 = (long)iVar3;
                pdVar15 = (double *)
                          ((long)local_d0.p +
                          (lVar16 - local_d0.begin.y) * local_d0.jstride * 8 +
                          (lVar8 - local_d0.begin.z) * local_d0.kstride * 8 +
                          lVar6 * local_d0.nstride + lVar7 * 8 + (long)local_d0.begin.x * -8);
                pdVar12 = (double *)
                          ((long)local_190.p +
                          (lVar16 - local_190.begin.y) * local_190.jstride * 8 +
                          (lVar8 - local_190.begin.z) * local_190.kstride * 8 +
                          lVar6 * local_190.nstride + lVar7 * 8 + (long)local_190.begin.x * -8);
                pdVar11 = (double *)
                          ((long)local_150.p +
                          (lVar16 - local_150.begin.y) * local_150.jstride * 8 +
                          (lVar8 - local_150.begin.z) * local_150.kstride * 8 +
                          lVar6 * local_150.nstride + lVar7 * 8 + (long)local_150.begin.x * -8);
                pdVar17 = (double *)
                          ((long)local_110.p +
                          (lVar16 - local_110.begin.y) * local_110.jstride * 8 +
                          (lVar8 - local_110.begin.z) * local_110.kstride * 8 +
                          lVar6 * local_110.nstride + lVar7 * 8 + (long)local_110.begin.x * -8);
                lVar16 = lVar7;
                do {
                  pdVar9 = pdVar17;
                  pdVar10 = pdVar15;
                  pdVar13 = pdVar12;
                  pdVar14 = pdVar11;
                  iVar5 = (last_scalar - first_scalar) + 1;
                  if (first_scalar <= last_scalar) {
                    do {
                      *pdVar10 = (*pdVar14 + *pdVar13) * dt + *pdVar9;
                      iVar5 = iVar5 + -1;
                      pdVar9 = pdVar9 + local_110.nstride;
                      pdVar10 = pdVar10 + local_d0.nstride;
                      pdVar13 = pdVar13 + local_190.nstride;
                      pdVar14 = pdVar14 + local_150.nstride;
                    } while (iVar5 != 0);
                  }
                  lVar16 = lVar16 + 1;
                  pdVar15 = pdVar15 + 1;
                  pdVar12 = pdVar12 + 1;
                  pdVar11 = pdVar11 + 1;
                  pdVar17 = pdVar17 + 1;
                } while (local_1ac.bigend.vect[0] + 1 != (int)lVar16);
              }
              bVar18 = iVar3 != local_1ac.bigend.vect[1];
              iVar3 = iVar3 + 1;
            } while (bVar18);
          }
          bVar18 = iVar2 != local_1ac.bigend.vect[2];
          iVar2 = iVar2 + 1;
        } while (bVar18);
      }
      amrex::MFIter::operator++(&local_90);
    } while (local_90.currentIndex < local_90.endIndex);
  }
  amrex::MFIter::~MFIter(&local_90);
  amrex::AmrLevel::FillPatch
            ((AmrLevel *)this,
             (MultiFab *)
             this_00.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>.
             _M_t.super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
             super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,
             ((IntVect *)
             ((long)this_00.
                    super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                    .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl + 0xc0))->vect[0],
             time,0,3,1,3);
  return;
}

Assistant:

void
PeleLM::scalar_advection_update (Real dt,
                                 int  first_scalar,
                                 int  last_scalar)
{
   //
   // Careful: If here, the sign of aofs is flipped (wrt the usual NS treatment).
   //
   const Real new_time   = state[State_Type].curTime();
   MultiFab&       S_new = get_new_data(State_Type);
   const MultiFab& S_old = get_old_data(State_Type);

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
   for (MFIter mfi(S_new,TilingIfNotGPU()); mfi.isValid(); ++mfi)
   {
       const Box& bx   = mfi.tilebox();
       auto const& snew   = S_new.array(mfi);
       auto const& sold   = S_old.const_array(mfi);
       auto const& adv    = aofs->const_array(mfi);
       auto const& ext_src = external_sources.const_array(mfi);

       amrex::ParallelFor(bx, [snew, sold, adv, ext_src, dt, first_scalar, last_scalar]
       AMREX_GPU_DEVICE (int i, int j, int k) noexcept
       {
           for (int n = first_scalar; n <= last_scalar; n++) {
               snew(i,j,k,n) = sold(i,j,k,n) + dt * (adv(i,j,k,n) + ext_src(i,j,k,n));
           }
       });
   }

   // Let's FillPatch the new class state density, so that it's ready for anyone using it further down in the SDC ite.
   FillPatch(*this,S_new,S_new.nGrow(),new_time,State_Type,Density,1,Density);
}